

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

void __thiscall
flatbuffers::(anonymous_namespace)::
SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
          (_anonymous_namespace_ *this,uchar *begin,uchar *end,size_t width,
          anon_class_16_2_e19d79f7 comparator,anon_class_8_1_6663148b swapper)

{
  _anonymous_namespace_ *a;
  _anonymous_namespace_ *this_00;
  bool bVar1;
  anon_class_8_1_6663148b aVar2;
  ulong width_00;
  _anonymous_namespace_ *p_Var3;
  _anonymous_namespace_ *b;
  anon_class_16_2_e19d79f7 comparator_00;
  anon_class_8_1_6663148b in_stack_ffffffffffffffa8;
  anon_class_8_1_6663148b local_50;
  long local_48;
  _anonymous_namespace_ *local_40;
  _anonymous_namespace_ *local_38;
  
  aVar2.struct_size = (size_t)comparator.key;
  comparator_00._0_8_ = comparator._0_8_;
  width_00 = width & 0xffff;
  local_48 = -(long)end;
  local_38 = this;
  local_40 = (_anonymous_namespace_ *)begin;
  while ((long)end < (long)local_40 - (long)local_38) {
    p_Var3 = local_38 + (long)end;
    a = local_38 + width_00;
    b = local_40;
    local_50.struct_size = aVar2.struct_size;
    while (this_00 = local_38, p_Var3 < b) {
      bVar1 = anon_unknown_0::CompareSerializedScalars
                        ((uint8_t *)a,(uint8_t *)(p_Var3 + width_00),comparator_00._0_8_);
      if (bVar1) {
        b = b + local_48;
        Parser::ParseVector::anon_class_8_1_6663148b::operator()
                  (&local_50,(uint8_t *)p_Var3,(uint8_t *)b);
      }
      else {
        p_Var3 = p_Var3 + (long)end;
      }
    }
    p_Var3 = p_Var3 + local_48;
    Parser::ParseVector::anon_class_8_1_6663148b::operator()
              (&local_50,(uint8_t *)local_38,(uint8_t *)p_Var3);
    aVar2.struct_size = local_50.struct_size;
    comparator_00.key = (FieldDef *)local_50.struct_size;
    SimpleQsort<unsigned_char,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__1,flatbuffers::Parser::ParseVector(flatbuffers::Type_const&,unsigned_int*,flatbuffers::FieldDef*,unsigned_long)::__2>
              (this_00,(uchar *)p_Var3,end,width_00,comparator_00,in_stack_ffffffffffffffa8);
    local_38 = b;
  }
  return;
}

Assistant:

static void SimpleQsort(T *begin, T *end, size_t width, F comparator,
                        S swapper) {
  if (end - begin <= static_cast<ptrdiff_t>(width)) return;
  auto l = begin + width;
  auto r = end;
  while (l < r) {
    if (comparator(begin, l)) {
      r -= width;
      swapper(l, r);
    } else {
      l += width;
    }
  }
  l -= width;
  swapper(begin, l);
  SimpleQsort(begin, l, width, comparator, swapper);
  SimpleQsort(r, end, width, comparator, swapper);
}